

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  _Rb_tree_node_base *p_Var1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  BFSEntry qe;
  bool bVar5;
  PolicyStatus PVar6;
  int iVar7;
  _Elt_pointer pBVar8;
  cmComputeComponentGraph *this_00;
  cmValue cVar9;
  cmake *pcVar10;
  _Rb_tree_node_base *p_Var11;
  iterator __position;
  iterator r;
  cmMakefile *pcVar12;
  PolicyID id;
  PolicyID id_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __end3;
  LinkEntry *pLVar13;
  pointer *ppbVar14;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __begin0;
  pointer puVar15;
  SharedDepEntry *dep;
  _Base_ptr p_Var16;
  LinkEntry *pLVar17;
  long lVar18;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __end0;
  pointer puVar19;
  value_type *__x;
  pointer __p;
  LinkEntry *__b;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar20;
  string errorMessage;
  EntriesProcessing entriesProcessing;
  RegularExpression processingOption;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [40];
  char *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Base_ptr local_388;
  undefined1 local_380 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  undefined1 local_350 [32];
  cmMakefile *local_330;
  undefined1 local_328 [24];
  _Rb_tree_node_base local_310;
  undefined8 local_2f0;
  _Base_ptr local_2e8;
  vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>> *local_2e0
  ;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_2d8;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *pmStack_2a8;
  cmGeneratorTarget *local_2a0;
  _Base_ptr local_298;
  cmList local_290;
  size_t local_278;
  size_t sStack_270;
  _Base_ptr local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [40];
  char *local_228;
  pointer local_220;
  char *local_158;
  __node_base local_150;
  _Base_ptr local_50;
  char *local_40;
  _Rb_tree_color local_38;
  
  AddDirectLinkEntries(this);
  pBVar8 = (this->BFSQueue).c.
           super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->BFSQueue).c.
      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar8) {
    do {
      local_268 = (_Base_ptr)pBVar8->LibDepends;
      local_278 = pBVar8->Index;
      sStack_270 = pBVar8->GroupIndex;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      pop_front(&(this->BFSQueue).c);
      qe.GroupIndex = sStack_270;
      qe.Index = local_278;
      qe.LibDepends = (char *)local_268;
      FollowLinkEntry(this,qe);
      pBVar8 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->BFSQueue).c.
             super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar8);
  }
  dep = (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->SharedDepQueue).c.
      super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    do {
      HandleSharedDependency(this,dep);
      std::
      deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ::pop_front(&(this->SharedDepQueue).c);
      dep = (this->SharedDepQueue).c.
            super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->SharedDepQueue).c.
             super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    Compute(this);
  }
  this_00 = (cmComputeComponentGraph *)operator_new(0xe0);
  cmComputeComponentGraph::cmComputeComponentGraph(this_00,&this->EntryConstraintGraph);
  local_260._0_8_ =
       (__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>)0x0;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,this_00);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              local_260);
  cmComputeComponentGraph::Compute
            ((this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl);
  bVar5 = CheckCircularDependencies(this);
  if (!bVar5) {
    return &this->FinalLinkEntries;
  }
  OrderLinkEntries(this);
  pcVar2 = this->Target;
  local_2e8 = (_Base_ptr)&this->EntryList;
  local_2e0 = (vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
               *)&this->FinalLinkEntries;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d8._M_impl.super__Rb_tree_header._M_header;
  local_2f0 = (_Base_ptr)0x100000001;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmStack_2a8 = (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *)0x0;
  pcVar12 = pcVar2->Makefile;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_298 = (_Base_ptr)local_2e0;
  PVar6 = cmPolicies::PolicyMap::Get(&pcVar2->PolicyMap,CMP0156);
  local_380._8_8_ = this;
  if (PVar6 - REQUIRED_IF_USED < 2) {
    pcVar10 = cmMakefile::GetCMakeInstance(pcVar12);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_260,(cmPolicies *)0x9c,id);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_3d8);
    cmake::IssueMessage(pcVar10,FATAL_ERROR,(string *)local_260,(cmListFileBacktrace *)local_3d8);
    if ((cmMakefile *)local_3d8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
    }
    if ((cmComputeComponentGraph *)local_260._0_8_ != (cmComputeComponentGraph *)local_250) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
    }
  }
  else {
    if (PVar6 == WARN) {
      pcVar10 = cmMakefile::GetCMakeInstance(pcVar12);
      bVar5 = cmake::GetIsInTryCompile(pcVar10);
      if (bVar5) {
        bVar5 = false;
      }
      else {
        local_3d8._0_8_ = local_3c8;
        local_260._0_8_ =
             (__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
              )0x1c;
        local_3d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3d8,(ulong)local_260);
        local_3c8._0_8_ = local_260._0_8_;
        builtin_strncpy((char *)((long)&(((element_type *)local_3d8._0_8_)->Value).Name.
                                        _M_string_length + 4),"_WARNING",8);
        builtin_strncpy((char *)((long)&(((element_type *)local_3d8._0_8_)->Value).Name.field_2 + 4)
                        ,"_CMP0156",8);
        (((tuple<cmTargetInternals_*,_std::default_delete<cmTargetInternals>_> *)
         &(((element_type *)local_3d8._0_8_)->Value).Name._M_dataplus._M_p)->
        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>).
        super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl =
             (cmTargetInternals *)0x4f505f454b414d43;
        (((element_type *)local_3d8._0_8_)->Value).Name._M_string_length = 0x5241575f5943494c;
        local_3d8._8_8_ = local_260._0_8_;
        *(char *)((long)(Graph **)local_260._0_8_ + (long)&((element_type *)local_3d8._0_8_)->Value)
             = '\0';
        bVar5 = cmMakefile::PolicyOptionalWarningEnabled(pcVar12,(string *)local_3d8);
        if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
        }
      }
      this = (cmComputeLinkDepends *)local_380._8_8_;
      if (bVar5 != false) {
        pcVar10 = cmMakefile::GetCMakeInstance(pcVar12);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_350,(cmPolicies *)0x9c,id_00);
        local_260._0_8_ = local_350._8_8_;
        local_260._8_8_ = local_350._0_8_;
        local_250._8_8_ = 0x57;
        local_250._16_8_ =
             "\nSince the policy is not set, legacy libraries de-duplication strategy will be applied."
        ;
        local_250._24_8_ = (pointer)0x0;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_260;
        local_250._0_8_ = (string *)local_350;
        cmCatViews((string *)local_328,views_04);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_260);
        cmake::IssueMessage(pcVar10,AUTHOR_WARNING,(string *)local_328,
                            (cmListFileBacktrace *)local_260);
        if ((cmMakefile *)local_260._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_);
        }
        if ((_Base_ptr)local_328._0_8_ != (_Base_ptr)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
        }
        if ((_Base_ptr)local_350._0_8_ != (_Base_ptr)(local_350 + 0x10)) {
          operator_delete((void *)local_350._0_8_,CONCAT71(local_350._17_7_,local_350[0x10]) + 1);
        }
      }
      goto LAB_0063f28f;
    }
    if (PVar6 != NEW) goto LAB_0063f28f;
  }
  local_260._0_8_ =
       (__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>)0x6;
  local_260._8_8_ = "CMAKE_";
  local_250._0_8_ = (string *)0x0;
  local_250._16_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_250._8_8_ = (this->LinkLanguage)._M_string_length;
  local_250._24_8_ = (pointer)0x0;
  local_250._32_8_ = 0x1a;
  local_228 = "_LINK_LIBRARIES_PROCESSING";
  local_220 = (pointer)0x0;
  views._M_len = 3;
  views._M_array = (iterator)local_260;
  cmCatViews((string *)local_3d8,views);
  cVar9 = cmMakefile::GetDefinition(pcVar12,(string *)local_3d8);
  if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
  }
  if (cVar9.Value != (string *)0x0) {
    local_50 = (_Base_ptr)0x0;
    local_40 = (char *)0x0;
    local_38 = _S_red;
    memset((RegularExpression *)local_260,0,0x20a);
    cmsys::RegularExpression::compile
              ((RegularExpression *)local_260,"^(ORDER|UNICITY)=(FORWARD|REVERSE|ALL|NONE|SHARED)$")
    ;
    local_350._0_8_ = local_350 + 0x10;
    local_350._8_8_ = (cmComputeComponentGraph *)0x0;
    local_350[0x10] = '\0';
    pcVar3 = ((cVar9.Value)->_M_dataplus)._M_p;
    local_3d8._0_8_ = (element_type *)local_3c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3d8,pcVar3,pcVar3 + (cVar9.Value)->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)local_3d8;
    cmList::cmList(&local_290,init);
    local_330 = pcVar12;
    local_2a0 = pcVar2;
    if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    if (local_290.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_290.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var16 = (_Base_ptr)
                local_290.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar5 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_260,*(char **)p_Var16,
                           (RegularExpressionMatch *)local_260);
        if (bVar5) {
          if ((cmMakefile *)local_260._8_8_ == (cmMakefile *)0x0) {
            local_3d8._8_8_ = (cmMakefile *)0x0;
            local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
            local_3d8._0_8_ = (element_type *)local_3c8;
          }
          else {
            local_3d8._0_8_ = (element_type *)local_3c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3d8,local_260._8_8_,local_158);
          }
          iVar7 = std::__cxx11::string::compare((char *)local_3d8);
          if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
            operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
          }
          if (iVar7 == 0) {
            if ((string *)local_250._0_8_ == (string *)0x0) {
              local_3d8._8_8_ = (cmMakefile *)0x0;
              local_3c8._0_8_ = (ulong)(uint7)local_3c8._1_7_ << 8;
              local_3d8._0_8_ = (element_type *)local_3c8;
            }
            else {
              local_3d8._0_8_ = (element_type *)local_3c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
            }
            iVar7 = std::__cxx11::string::compare((char *)local_3d8);
            if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
              operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
            }
            if (iVar7 == 0) {
              local_2f0 = (_Base_ptr)((ulong)local_2f0 & 0xffffffff00000000);
            }
            else {
              if ((string *)local_250._0_8_ == (string *)0x0) {
                local_3d8._8_8_ = (cmMakefile *)0x0;
                local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                local_3d8._0_8_ = (element_type *)local_3c8;
              }
              else {
                local_3d8._0_8_ = (element_type *)local_3c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
              }
              iVar7 = std::__cxx11::string::compare((char *)local_3d8);
              if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
              }
              if (iVar7 != 0) {
                local_3d8._0_8_ = (element_type *)0x2;
                local_3d8._8_8_ = "  ";
                local_3c8._0_8_ = (cmLocalGenerator *)0x0;
                local_3c8._16_8_ = *(undefined8 *)p_Var16;
                local_3c8._8_8_ = p_Var16->_M_parent;
                local_3c8._24_8_ = 0;
                local_328._0_8_ = (_Base_ptr)0x0;
                local_328._8_8_ = &DAT_00000001;
                local_3a0 = (char *)&local_310;
                local_310._M_color._0_1_ = 10;
                local_3c8._32_8_ = 1;
                local_398._M_allocated_capacity = 0;
                views_01._M_len = 3;
                views_01._M_array = (iterator)local_3d8;
                local_328._16_8_ = local_3a0;
                cmCatViews((string *)(local_380 + 0x10),views_01);
                std::__cxx11::string::_M_append(local_350,local_380._16_8_);
                goto LAB_0063eb0d;
              }
              local_2f0 = (_Base_ptr)CONCAT44(local_2f0._4_4_,1);
            }
          }
          else {
            if ((cmMakefile *)local_260._8_8_ == (cmMakefile *)0x0) {
              local_3d8._8_8_ = (cmMakefile *)0x0;
              local_3c8._0_8_ = (ulong)(uint7)local_3c8._1_7_ << 8;
              local_3d8._0_8_ = (element_type *)local_3c8;
            }
            else {
              local_3d8._0_8_ = (element_type *)local_3c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,local_260._8_8_,local_158);
            }
            iVar7 = std::__cxx11::string::compare((char *)local_3d8);
            if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
              operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
            }
            if (iVar7 == 0) {
              if ((string *)local_250._0_8_ == (string *)0x0) {
                local_3d8._8_8_ = (cmMakefile *)0x0;
                local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                local_3d8._0_8_ = (element_type *)local_3c8;
              }
              else {
                local_3d8._0_8_ = (element_type *)local_3c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
              }
              iVar7 = std::__cxx11::string::compare((char *)local_3d8);
              if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
              }
              if (iVar7 == 0) {
                local_2f0 = (_Base_ptr)CONCAT44(2,(OrderKind)local_2f0);
              }
              else {
                if ((string *)local_250._0_8_ == (string *)0x0) {
                  local_3d8._8_8_ = (cmMakefile *)0x0;
                  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                  local_3d8._0_8_ = (element_type *)local_3c8;
                }
                else {
                  local_3d8._0_8_ = (element_type *)local_3c8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
                }
                iVar7 = std::__cxx11::string::compare((char *)local_3d8);
                if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                  operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
                }
                if (iVar7 == 0) {
                  local_2f0 = (_Base_ptr)((ulong)local_2f0 & 0xffffffff);
                }
                else {
                  if ((string *)local_250._0_8_ == (string *)0x0) {
                    local_3d8._8_8_ = (cmMakefile *)0x0;
                    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffffffffff00;
                    local_3d8._0_8_ = (element_type *)local_3c8;
                  }
                  else {
                    local_3d8._0_8_ = (element_type *)local_3c8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3d8,local_250._0_8_,local_150._M_nxt);
                  }
                  iVar7 = std::__cxx11::string::compare((char *)local_3d8);
                  if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
                    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
                  }
                  if (iVar7 != 0) {
                    local_3d8._0_8_ = (element_type *)0x2;
                    local_3d8._8_8_ = "  ";
                    local_3c8._0_8_ = (cmLocalGenerator *)0x0;
                    local_3c8._16_8_ = *(undefined8 *)p_Var16;
                    local_3c8._8_8_ = p_Var16->_M_parent;
                    local_3c8._24_8_ = 0;
                    local_328._0_8_ = (_Base_ptr)0x0;
                    local_328._8_8_ = &DAT_00000001;
                    local_3a0 = (char *)&local_310;
                    local_310._M_color._0_1_ = 10;
                    local_3c8._32_8_ = 1;
                    local_398._M_allocated_capacity = 0;
                    views_02._M_len = 3;
                    views_02._M_array = (iterator)local_3d8;
                    local_328._16_8_ = local_3a0;
                    cmCatViews((string *)(local_380 + 0x10),views_02);
                    std::__cxx11::string::_M_append(local_350,local_380._16_8_);
                    goto LAB_0063eb0d;
                  }
                  local_2f0 = (_Base_ptr)CONCAT44(1,(OrderKind)local_2f0);
                }
              }
            }
          }
        }
        else {
          local_3d8._0_8_ = (element_type *)0x2;
          local_3d8._8_8_ = "  ";
          local_3c8._0_8_ = (cmLocalGenerator *)0x0;
          local_3c8._16_8_ = *(undefined8 *)p_Var16;
          local_3c8._8_8_ = p_Var16->_M_parent;
          local_3c8._24_8_ = 0;
          local_328._0_8_ = (_Base_ptr)0x0;
          local_328._8_8_ = &DAT_00000001;
          local_3a0 = (char *)&local_310;
          local_310._M_color._0_1_ = 10;
          local_3c8._32_8_ = 1;
          local_398._M_allocated_capacity = 0;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_3d8;
          local_328._16_8_ = local_3a0;
          cmCatViews((string *)(local_380 + 0x10),views_00);
          std::__cxx11::string::_M_append(local_350,local_380._16_8_);
LAB_0063eb0d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._16_8_ != &local_360) {
            operator_delete((void *)local_380._16_8_,local_360._M_allocated_capacity + 1);
          }
        }
        p_Var16 = p_Var16 + 1;
      } while (p_Var16 !=
               (_Base_ptr)
               local_290.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290.Values);
    this = (cmComputeLinkDepends *)local_380._8_8_;
    if ((cmComputeComponentGraph *)local_350._8_8_ != (cmComputeComponentGraph *)0x0) {
      pcVar10 = cmMakefile::GetCMakeInstance(local_330);
      local_3d8._0_8_ = (element_type *)0x1f;
      local_3d8._8_8_ = "Erroneous option(s) for \'CMAKE_";
      local_3c8._0_8_ = (cmLocalGenerator *)0x0;
      local_3c8._16_8_ = (((string *)((long)this + 0x20))->_M_dataplus)._M_p;
      local_3c8._8_8_ = *(size_type *)((long)this + 0x28);
      local_3c8._24_8_ = 0;
      local_3c8._32_8_ = 0x1d;
      local_3a0 = "_LINK_LIBRARIES_PROCESSING\':\n";
      local_398._M_allocated_capacity = 0;
      local_398._8_8_ = local_350._8_8_;
      local_388 = (_Base_ptr)local_350._0_8_;
      local_380._0_8_ = (pointer)0x0;
      views_03._M_len = 4;
      views_03._M_array = (iterator)local_3d8;
      cmCatViews((string *)local_328,views_03);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_3d8);
      cmake::IssueMessage(pcVar10,FATAL_ERROR,(string *)local_328,(cmListFileBacktrace *)local_3d8);
      if ((cmMakefile *)local_3d8._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
      }
      if ((_Base_ptr)local_328._0_8_ != (_Base_ptr)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
      }
    }
    if ((_Base_ptr)local_350._0_8_ != (_Base_ptr)(local_350 + 0x10)) {
      operator_delete((void *)local_350._0_8_,CONCAT71(local_350._17_7_,local_350[0x10]) + 1);
    }
    if (local_40 != (char *)0x0) {
      operator_delete__(local_40);
    }
  }
LAB_0063f28f:
  if ((this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pmStack_2a8 = (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)(local_380._8_8_ + 0xf0);
    p_Var11 = *(_Base_ptr *)(local_380._8_8_ + 0x108);
    p_Var1 = (_Rb_tree_node_base *)(local_380._8_8_ + 0xf8);
    if (p_Var11 != p_Var1) {
      do {
        p_Var4 = p_Var11[1]._M_left;
        for (p_Var16 = p_Var11[1]._M_parent; p_Var16 != p_Var4;
            p_Var16 = (_Base_ptr)&p_Var16->_M_parent) {
          local_260._0_8_ = *(undefined8 *)p_Var16;
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_2d8,(unsigned_long *)local_260);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != p_Var1);
    }
  }
  if ((OrderKind)local_2f0 == Reverse) {
    puVar19 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x288))
              ->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar15 = *(pointer *)(local_380._8_8_ + 0x290);
    if (puVar15 != puVar19) {
      do {
        local_260._0_8_ = puVar15[-1];
        pLVar17 = (LinkEntry *)(local_260._0_8_ * 0x68 + *(long *)local_2e8);
        bVar5 = anon_unknown.dwarf_2bbc9f5::EntriesProcessing::IncludeEntry
                          ((EntriesProcessing *)&local_2f0,pLVar17);
        if ((bVar5) ||
           (pVar20 = std::
                     _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     ::_M_insert_unique<unsigned_long_const&>
                               ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                 *)&local_2d8,(unsigned_long *)local_260),
           ((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          std::
          vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
          emplace_back<cmComputeLinkDepends::LinkEntry_const&>(local_2e0,pLVar17);
        }
        puVar15 = puVar15 + -1;
      } while (puVar15 != puVar19);
    }
  }
  else {
    puVar19 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x288))
              ->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar15 = *(pointer *)(local_380._8_8_ + 0x290);
    if (puVar19 != puVar15) {
      do {
        local_260._0_8_ = *puVar19;
        pLVar17 = (LinkEntry *)(local_260._0_8_ * 0x68 + *(long *)local_2e8);
        bVar5 = anon_unknown.dwarf_2bbc9f5::EntriesProcessing::IncludeEntry
                          ((EntriesProcessing *)&local_2f0,pLVar17);
        if ((bVar5) ||
           (pVar20 = std::
                     _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     ::_M_insert_unique<unsigned_long_const&>
                               ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                 *)&local_2d8,(unsigned_long *)local_260),
           ((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          std::
          vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
          emplace_back<cmComputeLinkDepends::LinkEntry_const&>(local_2e0,pLVar17);
        }
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar15);
    }
  }
  puVar19 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_380._8_8_ + 0x2e8))->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar15 = *(pointer *)(local_380._8_8_ + 0x2f0);
  if ((OrderKind)local_2f0 == Reverse) {
    for (; puVar15 != puVar19; puVar15 = puVar15 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      emplace_back<cmComputeLinkDepends::LinkEntry&>
                (local_2e0,(LinkEntry *)(puVar15[-1] * 0x68 + *(long *)local_2e8));
    }
  }
  else {
    for (; puVar15 != puVar19; puVar15 = puVar15 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      _M_emplace_aux<cmComputeLinkDepends::LinkEntry&>
                (local_2e0,*(LinkEntry **)local_2e0,
                 (LinkEntry *)(puVar15[-1] * 0x68 + *(long *)local_2e8));
    }
  }
  if ((OrderKind)local_2f0 == Reverse) {
    pLVar13 = *(LinkEntry **)local_2e0;
    __b = *(LinkEntry **)(local_2e0 + 8) + -1;
    if (pLVar13 < __b && pLVar13 != *(LinkEntry **)(local_2e0 + 8)) {
      do {
        std::swap<cmComputeLinkDepends::LinkEntry>(pLVar13,__b);
        pLVar13 = pLVar13 + 1;
        __b = __b + -1;
      } while (pLVar13 < __b);
    }
  }
  if (pmStack_2a8 !=
      (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       *)0x0) {
    pcVar12 = (cmMakefile *)(pmStack_2a8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_330 = (cmMakefile *)&(pmStack_2a8->_M_t)._M_impl.super__Rb_tree_header;
    if (pcVar12 != local_330) {
LAB_0063f519:
      __x = (value_type *)
            ((long)(pcVar12->FindPackageRootPathStack).
                   super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last * 0x68 + *(long *)local_2e8);
      r._M_current = *(LinkEntry **)local_2e0;
      do {
        pLVar13 = *(LinkEntry **)(local_2e0 + 8);
        lVar18 = ((long)pLVar13 - (long)r._M_current >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
        if (0 < lVar18) {
          lVar18 = lVar18 + 1;
          do {
            bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__x,&(r._M_current)->Item);
            __position._M_current = r._M_current;
            if (bVar5) goto LAB_0063f637;
            bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__x,&r._M_current[1].Item);
            __position._M_current = r._M_current + 1;
            if (bVar5) goto LAB_0063f637;
            bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__x,&r._M_current[2].Item);
            __position._M_current = r._M_current + 2;
            if (bVar5) goto LAB_0063f637;
            bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)__x,&r._M_current[3].Item);
            __position._M_current = r._M_current + 3;
            if (bVar5) goto LAB_0063f637;
            r._M_current = r._M_current + 4;
            lVar18 = lVar18 + -1;
          } while (1 < lVar18);
        }
        lVar18 = ((long)pLVar13 - (long)r._M_current >> 3) * 0x4ec4ec4ec4ec4ec5;
        if (lVar18 == 1) {
LAB_0063f623:
          bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)__x,&(r._M_current)->Item);
          __position._M_current = pLVar13;
          if (bVar5) {
            __position._M_current = r._M_current;
          }
        }
        else if (lVar18 == 2) {
LAB_0063f60b:
          bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)__x,&(r._M_current)->Item);
          __position._M_current = r._M_current;
          if (!bVar5) {
            r._M_current = r._M_current + 1;
            goto LAB_0063f623;
          }
        }
        else {
          __position._M_current = pLVar13;
          if ((lVar18 == 3) &&
             (bVar5 = ::operator==((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)__x,&(r._M_current)->Item),
             __position._M_current = r._M_current, !bVar5)) {
            r._M_current = r._M_current + 1;
            goto LAB_0063f60b;
          }
        }
LAB_0063f637:
        if (__position._M_current == *(LinkEntry **)(local_2e0 + 8)) goto LAB_0063f6cd;
        std::__cxx11::string::_M_replace
                  ((ulong)__position._M_current,0,
                   (char *)((__position._M_current)->Item).Value._M_string_length,0x8de194);
        for (ppbVar14 = (pointer *)
                        (pcVar12->FindPackageRootPathStack).
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            (_Elt_pointer)ppbVar14 !=
            (_Elt_pointer)
            (pcVar12->FindPackageRootPathStack).
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
            ppbVar14 = &(((_Elt_pointer)(ppbVar14 + -3))->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __position = std::
                       vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ::insert((vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                 *)local_2e0,__position._M_current,
                                (value_type *)
                                ((long)(((_Elt_pointer)(ppbVar14 + -3))->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage * 0x68 +
                                *(long *)local_2e8));
        }
        r = std::
            vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ::insert((vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      *)local_2e0,__position._M_current,__x);
        std::__cxx11::string::_M_replace
                  ((ulong)r._M_current,0,(char *)((r._M_current)->Item).Value._M_string_length,
                   0x8de1a2);
      } while( true );
    }
  }
LAB_0063f6e6:
  if (*(bool *)(local_380._8_8_ + 0x30d) == true) {
    DisplayFinalEntries((cmComputeLinkDepends *)local_380._8_8_);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_2d8);
  return (vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          *)local_298;
LAB_0063f6cd:
  pcVar12 = (cmMakefile *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar12);
  if (pcVar12 == local_330) goto LAB_0063f6e6;
  goto LAB_0063f519;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  EntriesProcessing entriesProcessing{ this->Target, this->LinkLanguage,
                                       this->EntryList,
                                       this->FinalLinkEntries };
  // Add groups first, to ensure that libraries of the groups are always kept.
  entriesProcessing.AddGroups(this->GroupItems);
  entriesProcessing.AddLibraries(this->FinalLinkOrder);
  entriesProcessing.AddObjects(this->ObjectEntries);
  entriesProcessing.Finalize();

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}